

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

double opengv::absolute_pose::modules::gpnp_evaluate
                 (Matrix<double,_12,_1,_0,_12,_1> *solution,points_t *c,translation_t *t,
                 rotation_t *R)

{
  TransposeReturnType this;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_RSI;
  point_t ccam_reprojected;
  size_t i_1;
  double error;
  transformation_t transformation;
  size_t i;
  points_t ccam;
  DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *in_stack_fffffffffffffdc0;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffdc8;
  Index in_stack_fffffffffffffdd0;
  DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *in_stack_fffffffffffffdd8;
  MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *in_stack_fffffffffffffde0;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffde8;
  ulong local_1b0;
  double local_1a8;
  ulong local_70;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_68;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *local_40;
  
  local_40 = in_RSI;
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            *)0x7c9c6c);
  for (local_70 = 0; local_70 < 4; local_70 = local_70 + 1) {
    Eigen::DenseBase<Eigen::Matrix<double,12,1,0,12,1>>::block<3,1>
              ((DenseBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_> *)in_stack_fffffffffffffdd8,
               in_stack_fffffffffffffdd0,(Index)in_stack_fffffffffffffdc8);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>const,3,1,false>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffdc8,
               (EigenBase<Eigen::Block<const_Eigen::Matrix<double,_12,_1,_0,_12,_1>,_3,_1,_false>_>
                *)in_stack_fffffffffffffdc0);
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::push_back((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 *)in_stack_fffffffffffffdc8,(value_type *)in_stack_fffffffffffffdc0);
  }
  math::arun_complete((points_t *)
                      ccam_reprojected.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array[1],
                      (points_t *)
                      ccam_reprojected.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array[0]);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>::col
            (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffdc8,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true>_> *)
             in_stack_fffffffffffffdc0);
  Eigen::DenseBase<Eigen::Matrix<double,3,4,0,3,4>>::block<3,3>
            (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,(Index)in_stack_fffffffffffffdc8);
  Eigen::Matrix<double,3,3,0,3,3>::operator=
            ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffffdc8,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false>_> *)
             in_stack_fffffffffffffdc0);
  local_1a8 = 0.0;
  for (local_1b0 = 0; local_1b0 < 4; local_1b0 = local_1b0 + 1) {
    this = Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
                     (in_stack_fffffffffffffdc0);
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::operator[](local_40,local_1b0);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
              ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)this.m_matrix,
               in_stack_fffffffffffffde8);
    Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>::operator*
              (in_stack_fffffffffffffde0,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)in_stack_fffffffffffffdd8);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>,0>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffdc8,
               (EigenBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>
                *)in_stack_fffffffffffffdc0);
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::operator[](&local_68,local_1b0);
    in_stack_fffffffffffffde8 =
         (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
         Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::dot<Eigen::Matrix<double,3,1,0,3,1>>
                   (in_stack_fffffffffffffdc8,
                    (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffdc0);
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::operator[](&local_68,local_1b0);
    in_stack_fffffffffffffde0 =
         (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
         Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
                   ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffdc0);
    in_stack_fffffffffffffdd8 =
         (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)
         Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
                   ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffdc0);
    local_1a8 = (1.0 - (double)in_stack_fffffffffffffde8 /
                       ((double)in_stack_fffffffffffffde0 * (double)in_stack_fffffffffffffdd8)) +
                local_1a8;
  }
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             *)in_stack_fffffffffffffdd8);
  return local_1a8;
}

Assistant:

double
opengv::absolute_pose::modules::gpnp_evaluate(
    const Eigen::Matrix<double,12,1> & solution,
    const points_t & c,
    translation_t & t,
    rotation_t & R )
{
  points_t ccam;
  for(size_t i = 0; i<4; i++)
    ccam.push_back(solution.block<3,1>(i*3,0));

  transformation_t transformation = math::arun_complete(c,ccam);
  t = transformation.col(3);
  R = transformation.block<3,3>(0,0);

  //transform world points into camera frame and compute the error
  double error = 0.0;
  for(size_t i = 0; i<4; i++)
  {
    point_t ccam_reprojected = R.transpose() * (c[i] - t);
    error +=
        1.0 -
        (ccam_reprojected.dot(ccam[i])/(ccam[i].norm()*ccam_reprojected.norm()));
  }

  return error;
}